

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O2

void __thiscall Executor::load(Executor *this)

{
  uint numberOfUnits;
  Values initial;
  uint local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::operator<<((ostream *)&std::cout,"Insert number of units:\n> ");
  std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
  if (local_4c != 0) {
    loadSizes(this,local_4c);
    loadDesired(this,local_4c);
    loadInitial((Values *)&local_28,this,local_4c);
    local_48._M_impl.super__Vector_impl_data._M_start =
         local_28._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         local_28._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_28._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    execute(this,(Values *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  }
  return;
}

Assistant:

void Executor::load()
{
    unsigned int numberOfUnits;

    std::cout << "Insert number of units:\n> ";
    std::cin >> numberOfUnits;

    if (numberOfUnits <= 0)
        return;

    // Load states and sizes

    loadSizes(numberOfUnits);
    loadDesired(numberOfUnits);
    Values initial = loadInitial(numberOfUnits);

    execute(std::move(initial));
}